

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

bool __thiscall
__gnu_cxx::__ops::
_Val_comp_iter<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/Filesystem.cc:647:15)>
::anon_class_1_0_00000001_for__M_comp::operator()
          (anon_class_1_0_00000001_for__M_comp *this,pollfd *x,pollfd *y)

{
  pollfd *y_local;
  pollfd *x_local;
  anon_class_1_0_00000001_for__M_comp *this_local;
  
  return x->fd < y->fd;
}

Assistant:

void Poll::add(int fd, short events) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  pfd.events = events;
  auto insert_it = upper_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (insert_it != this->poll_fds.end() && insert_it->fd == fd) {
    insert_it->events = events;
  } else {
    this->poll_fds.insert(insert_it, pfd);
  }
}